

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcShow.c
# Opt level: O1

void Wlc_NtkDumpDot(Wlc_Ntk_t *p,char *pFileName,Vec_Int_t *vBold)

{
  int *piVar1;
  Wlc_Obj_t WVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  FILE *__stream;
  long lVar7;
  char *pcVar8;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar9;
  int iVar10;
  ulong uVar11;
  char *pcVar12;
  Wlc_Obj_t *pWVar13;
  size_t __size;
  byte bVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  
  if (vBold == (Vec_Int_t *)0x0) {
    if (p->iObj < 0x7d2) goto LAB_00378eed;
  }
  else if (vBold->nSize < 0x7d1) {
LAB_00378eed:
    __stream = fopen(pFileName,"w");
    if (__stream == (FILE *)0x0) {
      fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",pFileName);
      return;
    }
    if ((vBold != (Vec_Int_t *)0x0) && (0 < vBold->nSize)) {
      lVar7 = 0;
      do {
        iVar4 = vBold->pArray[lVar7];
        if (((long)iVar4 < 1) || (p->nObjsAlloc <= iVar4)) goto LAB_0037a330;
        *(ushort *)(p->pObjs + iVar4) = *(ushort *)(p->pObjs + iVar4) | 0x80;
        lVar7 = lVar7 + 1;
      } while (lVar7 < vBold->nSize);
    }
    iVar4 = Wlc_NtkCreateLevels(p);
    uVar15 = iVar4 + 1;
    if (vBold != (Vec_Int_t *)0x0) {
      uVar15 = Wlc_NtkRemapLevels(p,vBold,uVar15);
    }
    uVar11 = (ulong)uVar15;
    fprintf(__stream,"# %s\n","WLC structure generated by ABC");
    fputc(10,__stream);
    fwrite("digraph WLC {\n",0xe,1,__stream);
    fwrite("size = \"7.5,10\";\n",0x11,1,__stream);
    fwrite("center = true;\n",0xf,1,__stream);
    fwrite("edge [dir = back];\n",0x13,1,__stream);
    fputc(10,__stream);
    fwrite("{\n",2,1,__stream);
    fwrite("  node [shape = plaintext];\n",0x1c,1,__stream);
    fwrite("  edge [style = invis];\n",0x18,1,__stream);
    fwrite("  LevelTitle1 [label=\"\"];\n",0x1a,1,__stream);
    fwrite("  LevelTitle2 [label=\"\"];\n",0x1a,1,__stream);
    uVar16 = uVar11;
    if (-1 < (int)uVar15) {
      do {
        iVar4 = (int)uVar16;
        fprintf(__stream,"  Level%d",uVar16);
        fwrite(" [label = ",10,1,__stream);
        fputc(0x22,__stream);
        fputc(0x22,__stream);
        fwrite("];\n",3,1,__stream);
        uVar16 = (ulong)(iVar4 - 1);
      } while (0 < iVar4);
    }
    fwrite("  LevelTitle1 ->  LevelTitle2 ->",0x20,1,__stream);
    uVar16 = uVar11;
    if (-1 < (int)uVar15) {
      do {
        iVar4 = (int)uVar16;
        fprintf(__stream,"  Level%d",uVar16);
        if (iVar4 == 0) {
          fputc(0x3b,__stream);
        }
        else {
          fwrite(" ->",3,1,__stream);
        }
        uVar16 = (ulong)(iVar4 - 1);
      } while (0 < iVar4);
    }
    fputc(10,__stream);
    fputc(0x7d,__stream);
    fputc(10,__stream);
    fputc(10,__stream);
    fwrite("{\n",2,1,__stream);
    fwrite("  rank = same;\n",0xf,1,__stream);
    fwrite("  LevelTitle1;\n",0xf,1,__stream);
    fwrite("  title1 [shape=plaintext,\n",0x1b,1,__stream);
    fwrite("          fontsize=20,\n",0x17,1,__stream);
    fwrite("          fontname = \"Times-Roman\",\n",0x24,1,__stream);
    fwrite("          label=\"",0x11,1,__stream);
    fputs("WLC structure generated by ABC",__stream);
    fwrite("\\n",2,1,__stream);
    pcVar12 = p->pName;
    if (p->pSpec == (char *)0x0) {
      pcVar8 = "unknown";
    }
    else {
      pcVar8 = Extra_FileNameWithoutPath(p->pSpec);
    }
    fprintf(__stream,"Benchmark \\\"%s\\\" from file \\\"%s\\\". ",pcVar12,pcVar8);
    fwrite("\"\n",2,1,__stream);
    fwrite("         ];\n",0xc,1,__stream);
    fputc(0x7d,__stream);
    fputc(10,__stream);
    fputc(10,__stream);
    fwrite("{\n",2,1,__stream);
    fwrite("  rank = same;\n",0xf,1,__stream);
    fwrite("  LevelTitle2;\n",0xf,1,__stream);
    fwrite("  title2 [shape=plaintext,\n",0x1b,1,__stream);
    fwrite("          fontsize=18,\n",0x17,1,__stream);
    fwrite("          fontname = \"Times-Roman\",\n",0x24,1,__stream);
    fwrite("          label=\"",0x11,1,__stream);
    uVar16 = (ulong)(uVar15 - 1);
    fprintf(__stream,"The word-level network contains %d nodes and spans %d levels.",
            (ulong)(uint)(~(p->vCis).nSize + p->iObj),uVar16);
    fwrite("\\n",2,1,__stream);
    fwrite("\"\n",2,1,__stream);
    fwrite("         ];\n",0xc,1,__stream);
    fputc(0x7d,__stream);
    fputc(10,__stream);
    fputc(10,__stream);
    fwrite("{\n",2,1,__stream);
    fwrite("  rank = same;\n",0xf,1,__stream);
    fprintf(__stream,"  Level%d;\n",uVar11);
    if (0 < (p->vCos).nSize) {
      lVar7 = 0;
      do {
        iVar4 = (p->vCos).pArray[lVar7];
        if (((long)iVar4 < 1) || (p->nObjsAlloc <= iVar4)) goto LAB_0037a330;
        pWVar13 = p->pObjs;
        if ((vBold == (Vec_Int_t *)0x0) ||
           ((undefined1  [24])((undefined1  [24])pWVar13[iVar4] & (undefined1  [24])0x80) !=
            (undefined1  [24])0x0)) {
          iVar4 = (p->vPos).nSize;
          if (lVar7 < iVar4) {
            uVar5 = (p->vPos).pArray[lVar7];
          }
          else {
            uVar11 = (ulong)(uint)((p->vPis).nSize - iVar4) + lVar7;
            iVar4 = (int)uVar11;
            if ((iVar4 < 0) || ((p->vCis).nSize <= iVar4)) goto LAB_0037a34f;
            uVar5 = (p->vCis).pArray[uVar11 & 0xffffffff];
          }
          if (((int)uVar5 < 1) || (p->nObjsAlloc <= (int)uVar5)) goto LAB_0037a330;
          pcVar8 = Wlc_ObjName(p,uVar5);
          pcVar12 = "T = %d\t\t";
          if ((*(uint *)(pWVar13 + uVar5) >> 9 & 1) == 0) {
            pcVar12 = "mem_data_in";
          }
          iVar10 = pWVar13[uVar5].End - pWVar13[uVar5].Beg;
          iVar4 = -iVar10;
          if (0 < iVar10) {
            iVar4 = iVar10;
          }
          fprintf(__stream,"  NodePo%d [label = \"%s%s %d\"",(ulong)uVar5,pcVar8,pcVar12 + 8,
                  (ulong)(iVar4 + 1));
          pcVar12 = "box";
          if (lVar7 < (p->vPos).nSize) {
            pcVar12 = "invtriangle";
          }
          fprintf(__stream,", shape = %s",pcVar12);
          fwrite(", color = coral, fillcolor = coral",0x22,1,__stream);
          fwrite("];\n",3,1,__stream);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < (p->vCos).nSize);
    }
    fputc(0x7d,__stream);
    fputc(10,__stream);
    fputc(10,__stream);
    while (1 < (int)uVar15) {
      fwrite("{\n",2,1,__stream);
      fwrite("  rank = same;\n",0xf,1,__stream);
      fprintf(__stream,"  Level%d;\n",uVar16);
      uVar15 = (uint)uVar16;
      if (1 < p->iObj) {
        uVar16 = 1;
        do {
          if ((long)p->nObjsAlloc <= (long)uVar16) goto LAB_0037a330;
          if ((long)(p->vLevels).nSize <= (long)uVar16) goto LAB_0037a34f;
          if (((p->vLevels).pArray[uVar16] == uVar15) &&
             ((pWVar13 = p->pObjs + uVar16, vBold == (Vec_Int_t *)0x0 ||
              ((undefined1  [24])((undefined1  [24])*pWVar13 & (undefined1  [24])0x80) !=
               (undefined1  [24])0x0)))) {
            uVar5 = *(ushort *)pWVar13 & 0x3f;
            if (uVar5 - 7 < 2) {
              iVar10 = pWVar13->End - pWVar13->Beg;
              iVar4 = -iVar10;
              if (0 < iVar10) {
                iVar4 = iVar10;
              }
              fprintf(__stream,"  Node%d [label = \"%d: %d\"",uVar16 & 0xffffffff,
                      uVar16 & 0xffffffff,(ulong)(iVar4 + 1));
            }
            else if (uVar5 == 6) {
              iVar10 = pWVar13->End - pWVar13->Beg;
              iVar4 = -iVar10;
              if (0 < iVar10) {
                iVar4 = iVar10;
              }
              fprintf(__stream,"  Node%d [label = \"%d:%d\'h",uVar16 & 0xffffffff,
                      uVar16 & 0xffffffff,(ulong)(iVar4 + 1));
              uVar6 = pWVar13->End - pWVar13->Beg;
              uVar5 = -uVar6;
              if (0 < (int)uVar6) {
                uVar5 = uVar6;
              }
              if (uVar5 < 0x40) {
                if ((*(ushort *)pWVar13 & 0x3f) != 6) goto LAB_0037a36e;
                piVar1 = (pWVar13->field_10).pFanins[0];
                iVar4 = (uVar5 + 4 >> 2) + 1;
                uVar5 = uVar5 + 4 & 0xfffffffc;
                do {
                  uVar5 = uVar5 - 4;
                  uVar6 = (uint)(*(ulong *)(piVar1 + (ulong)(iVar4 - 2U >> 4) * 2) >>
                                ((byte)uVar5 & 0x3c)) & 0xf;
                  iVar10 = uVar6 + 0x30;
                  if (9 < uVar6) {
                    iVar10 = uVar6 + 0x57;
                  }
                  fputc(iVar10,__stream);
                  iVar4 = iVar4 + -1;
                } while (1 < iVar4);
              }
              else {
                if ((*(ushort *)pWVar13 & 0x3f) != 6) goto LAB_0037a36e;
                piVar1 = (pWVar13->field_10).pFanins[0];
                uVar5 = 0x11;
                bVar14 = 0x3c;
                do {
                  uVar6 = (uint)(*(ulong *)(piVar1 + (ulong)(uVar5 - 2 >> 4) * 2) >> (bVar14 & 0x3c)
                                ) & 0xf;
                  iVar4 = uVar6 + 0x30;
                  if (9 < uVar6) {
                    iVar4 = uVar6 + 0x57;
                  }
                  fputc(iVar4,__stream);
                  uVar5 = uVar5 - 1;
                  bVar14 = bVar14 - 4;
                } while (1 < uVar5);
                fwrite("...",3,1,__stream);
              }
              fputc(0x22,__stream);
            }
            else {
              pcVar12 = Wlc_ObjTypeName(pWVar13);
              if ((ushort)((short)uVar5 - 0x1aU) < 0xb) {
                fprintf(__stream,"  Node%d [label = \"%d:%s\"",uVar16 & 0xffffffff,
                        uVar16 & 0xffffffff,pcVar12);
              }
              else {
                iVar10 = pWVar13->End - pWVar13->Beg;
                iVar4 = -iVar10;
                if (0 < iVar10) {
                  iVar4 = iVar10;
                }
                fprintf(__stream,"  Node%d [label = \"%d:%s %d\"",uVar16 & 0xffffffff,
                        uVar16 & 0xffffffff,pcVar12,(ulong)(iVar4 + 1));
              }
            }
            uVar6 = (uint)*(ushort *)pWVar13;
            uVar5 = uVar6 & 0x3f;
            if (uVar5 == 0x2d) {
              __size = 0x16;
              pcVar12 = ", shape = doublecircle";
            }
            else if ((ushort)((short)uVar5 - 0x1fU) < 6) {
              __size = 0x11;
              pcVar12 = ", shape = diamond";
            }
            else if (uVar5 < 0x1a) {
              if ((0xc00020U >> (uVar6 & 0x1f) & 1) == 0) {
                if ((0x3000080U >> (uVar6 & 0x1f) & 1) == 0) {
                  if (uVar5 != 8) goto LAB_003799b4;
                  __size = 0x13;
                  pcVar12 = ", shape = trapezium";
                }
                else {
                  __size = 0x12;
                  pcVar12 = ", shape = triangle";
                }
              }
              else {
                __size = 0xd;
                pcVar12 = ", shape = box";
              }
            }
            else {
LAB_003799b4:
              __size = 0x11;
              pcVar12 = ", shape = ellipse";
            }
            fwrite(pcVar12,__size,1,__stream);
            if (vBold == (Vec_Int_t *)0x0) {
              uVar3 = *(ushort *)pWVar13 & 0x3f;
              if (uVar3 == 0xf || (ushort)(uVar3 - 0x2b) < 10) goto LAB_003799da;
            }
            else if ((char)*(ushort *)pWVar13 < '\0') {
LAB_003799da:
              fwrite(", style = filled",0x10,1,__stream);
            }
            fwrite("];\n",3,1,__stream);
          }
          uVar16 = uVar16 + 1;
        } while ((long)uVar16 < (long)p->iObj);
      }
      fputc(0x7d,__stream);
      fputc(10,__stream);
      fputc(10,__stream);
      uVar16 = (ulong)(uVar15 - 1);
    }
    uVar16 = 1;
    fwrite("{\n",2,1,__stream);
    fwrite("  rank = same;\n",0xf,1,__stream);
    fprintf(__stream,"  Level%d;\n",0);
    if (1 < p->iObj) {
      do {
        if ((long)p->nObjsAlloc <= (long)uVar16) goto LAB_0037a330;
        pWVar13 = p->pObjs + uVar16;
        WVar2 = *pWVar13;
        if ((((undefined1  [24])((undefined1  [24])WVar2 & (undefined1  [24])0x3d) ==
              (undefined1  [24])0x1) || ((int)pWVar13->nFanins < 1)) &&
           ((vBold == (Vec_Int_t *)0x0 ||
            ((undefined1  [24])((undefined1  [24])WVar2 & (undefined1  [24])0x80) !=
             (undefined1  [24])0x0)))) {
          if ((undefined1  [24])((undefined1  [24])WVar2 & (undefined1  [24])0x3f) ==
              (undefined1  [24])0x6) {
            iVar10 = pWVar13->End - pWVar13->Beg;
            iVar4 = -iVar10;
            if (0 < iVar10) {
              iVar4 = iVar10;
            }
            fprintf(__stream,"  Node%d [label = \"%d:%d\'h",uVar16 & 0xffffffff,uVar16 & 0xffffffff,
                    (ulong)(iVar4 + 1));
            uVar5 = pWVar13->End - pWVar13->Beg;
            uVar15 = -uVar5;
            if (0 < (int)uVar5) {
              uVar15 = uVar5;
            }
            if (uVar15 < 0x40) {
              if ((*(ushort *)pWVar13 & 0x3f) != 6) goto LAB_0037a36e;
              piVar1 = (pWVar13->field_10).pFanins[0];
              iVar4 = (uVar15 + 4 >> 2) + 1;
              uVar15 = uVar15 + 4 & 0xfffffffc;
              do {
                uVar15 = uVar15 - 4;
                uVar5 = (uint)(*(ulong *)(piVar1 + (ulong)(iVar4 - 2U >> 4) * 2) >>
                              ((byte)uVar15 & 0x3c)) & 0xf;
                iVar10 = uVar5 + 0x30;
                if (9 < uVar5) {
                  iVar10 = uVar5 + 0x57;
                }
                fputc(iVar10,__stream);
                iVar4 = iVar4 + -1;
              } while (1 < iVar4);
            }
            else {
              if ((*(ushort *)pWVar13 & 0x3f) != 6) {
LAB_0037a36e:
                __assert_fail("p->Type == WLC_OBJ_CONST",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                              ,0x145,"int *Wlc_ObjConstValue(Wlc_Obj_t *)");
              }
              piVar1 = (pWVar13->field_10).pFanins[0];
              uVar15 = 0x11;
              bVar14 = 0x3c;
              do {
                uVar5 = (uint)(*(ulong *)(piVar1 + (ulong)(uVar15 - 2 >> 4) * 2) >> (bVar14 & 0x3c))
                        & 0xf;
                iVar4 = uVar5 + 0x30;
                if (9 < uVar5) {
                  iVar4 = uVar5 + 0x57;
                }
                fputc(iVar4,__stream);
                uVar15 = uVar15 - 1;
                bVar14 = bVar14 - 4;
              } while (1 < uVar15);
              fwrite("...",3,1,__stream);
            }
            fputc(0x22,__stream);
          }
          else {
            pcVar12 = Wlc_ObjName(p,(int)uVar16);
            iVar10 = pWVar13->End - pWVar13->Beg;
            iVar4 = -iVar10;
            if (0 < iVar10) {
              iVar4 = iVar10;
            }
            fprintf(__stream,"  Node%d [label = \"%d:%s %d\"",uVar16 & 0xffffffff,
                    uVar16 & 0xffffffff,pcVar12,(ulong)(iVar4 + 1));
            pcVar12 = "triangle";
            if ((p->vFfs2).nSize < 1) {
              if ((undefined1  [24])((undefined1  [24])*pWVar13 & (undefined1  [24])0x3d) !=
                  (undefined1  [24])0x1) {
                __assert_fail("Wlc_ObjIsCi(p)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                              ,0x12d,"int Wlc_ObjCiId(Wlc_Obj_t *)");
              }
              pcVar12 = "box";
              if ((pWVar13->field_10).Fanins[1] < (p->vPis).nSize) {
                pcVar12 = "triangle";
              }
            }
            fprintf(__stream,", shape = %s",pcVar12);
            fwrite(", color = coral, fillcolor = coral",0x22,1,__stream);
          }
          fwrite("];\n",3,1,__stream);
        }
        uVar16 = uVar16 + 1;
      } while ((long)uVar16 < (long)p->iObj);
    }
    fputc(0x7d,__stream);
    fputc(10,__stream);
    fputc(10,__stream);
    fwrite("title1 -> title2 [style = invis];\n",0x22,1,__stream);
    if (0 < (p->vCos).nSize) {
      lVar7 = 0;
      do {
        iVar4 = (p->vCos).pArray[lVar7];
        if (((long)iVar4 < 1) || (p->nObjsAlloc <= iVar4)) goto LAB_0037a330;
        if ((vBold == (Vec_Int_t *)0x0) ||
           ((undefined1  [24])((undefined1  [24])p->pObjs[iVar4] & (undefined1  [24])0x80) !=
            (undefined1  [24])0x0)) {
          iVar4 = (p->vPos).nSize;
          if (lVar7 < iVar4) {
            iVar4 = (p->vPos).pArray[lVar7];
          }
          else {
            uVar16 = (ulong)(uint)((p->vPis).nSize - iVar4) + lVar7;
            iVar4 = (int)uVar16;
            if ((iVar4 < 0) || ((p->vCis).nSize <= iVar4)) goto LAB_0037a34f;
            iVar4 = (p->vCis).pArray[uVar16 & 0xffffffff];
          }
          if ((iVar4 < 1) || (p->nObjsAlloc <= iVar4)) goto LAB_0037a330;
          fprintf(__stream,"title2 -> NodePo%d [style = invis];\n");
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < (p->vCos).nSize);
    }
    if (0 < (p->vCos).nSize) {
      iVar4 = -1;
      lVar7 = 0;
      do {
        iVar10 = (p->vCos).pArray[lVar7];
        if ((iVar10 < 1) || (p->nObjsAlloc <= iVar10)) goto LAB_0037a330;
        pWVar13 = p->pObjs;
        iVar10 = (p->vPos).nSize;
        if (lVar7 < iVar10) {
          uVar15 = (p->vPos).pArray[lVar7];
        }
        else {
          uVar16 = (ulong)(uint)((p->vPis).nSize - iVar10) + lVar7;
          iVar10 = (int)uVar16;
          if ((iVar10 < 0) || ((p->vCis).nSize <= iVar10)) goto LAB_0037a34f;
          uVar15 = (p->vCis).pArray[uVar16 & 0xffffffff];
        }
        if (((int)uVar15 < 1) || (p->nObjsAlloc <= (int)uVar15)) goto LAB_0037a330;
        if ((vBold == (Vec_Int_t *)0x0) ||
           ((undefined1  [24])((undefined1  [24])pWVar13[uVar15] & (undefined1  [24])0x80) !=
            (undefined1  [24])0x0)) {
          if (-1 < iVar4) {
            fprintf(__stream,"NodePo%d -> NodePo%d [style = invis];\n");
          }
          iVar4 = (int)((ulong)((long)(pWVar13 + uVar15) - (long)p->pObjs) >> 3) * -0x55555555;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < (p->vCos).nSize);
    }
    if (0 < (p->vCis).nSize) {
      iVar4 = -1;
      lVar7 = 0;
      do {
        iVar10 = (p->vCis).pArray[lVar7];
        if (((long)iVar10 < 1) || (p->nObjsAlloc <= iVar10)) goto LAB_0037a330;
        pWVar13 = p->pObjs;
        if ((vBold == (Vec_Int_t *)0x0) ||
           ((undefined1  [24])((undefined1  [24])pWVar13[iVar10] & (undefined1  [24])0x80) !=
            (undefined1  [24])0x0)) {
          if (-1 < iVar4) {
            fprintf(__stream,"Node%d -> Node%d [style = invis];\n");
          }
          iVar4 = (int)((ulong)((long)(pWVar13 + iVar10) - (long)p->pObjs) >> 3) * -0x55555555;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < (p->vCis).nSize);
    }
    if (0 < (p->vCos).nSize) {
      lVar7 = 0;
      do {
        iVar4 = (p->vCos).pArray[lVar7];
        if (((long)iVar4 < 1) || (p->nObjsAlloc <= iVar4)) goto LAB_0037a330;
        pWVar13 = p->pObjs + iVar4;
        if ((vBold == (Vec_Int_t *)0x0) ||
           ((undefined1  [24])((undefined1  [24])*pWVar13 & (undefined1  [24])0x80) !=
            (undefined1  [24])0x0)) {
          iVar4 = (p->vPos).nSize;
          if (lVar7 < iVar4) {
            iVar4 = (p->vPos).pArray[lVar7];
          }
          else {
            uVar16 = (ulong)(uint)((p->vPis).nSize - iVar4) + lVar7;
            iVar4 = (int)uVar16;
            if ((iVar4 < 0) || ((p->vCis).nSize <= iVar4)) {
LAB_0037a34f:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar4 = (p->vCis).pArray[uVar16 & 0xffffffff];
          }
          if ((iVar4 < 1) || (p->nObjsAlloc <= iVar4)) goto LAB_0037a330;
          fprintf(__stream,"NodePo%d");
          fwrite(" -> ",4,1,__stream);
          fprintf(__stream,"Node%d",
                  (ulong)(uint)((int)((ulong)((long)pWVar13 - (long)p->pObjs) >> 3) * -0x55555555));
          fwrite(" [",2,1,__stream);
          pcVar12 = "dotted";
          if ((undefined1  [24])((undefined1  [24])*pWVar13 & (undefined1  [24])0x40) ==
              (undefined1  [24])0x0) {
            pcVar12 = "solid";
          }
          fprintf(__stream,"style = %s",pcVar12);
          fputc(0x5d,__stream);
          fwrite(";\n",2,1,__stream);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < (p->vCos).nSize);
    }
    if (1 < p->iObj) {
      lVar7 = 1;
      do {
        if (p->nObjsAlloc <= lVar7) {
LAB_0037a330:
          __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                        ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
        }
        WVar2 = p->pObjs[lVar7];
        if (((undefined1  [24])((undefined1  [24])WVar2 & (undefined1  [24])0x3d) !=
             (undefined1  [24])0x1) &&
           ((vBold == (Vec_Int_t *)0x0 ||
            ((undefined1  [24])((undefined1  [24])WVar2 & (undefined1  [24])0x80) !=
             (undefined1  [24])0x0)))) {
          pWVar13 = p->pObjs + lVar7;
          uVar16 = (ulong)pWVar13->nFanins;
          if (0 < (int)pWVar13->nFanins) {
            lVar17 = 0;
            do {
              if ((2 < (uint)uVar16) ||
                 (paVar9 = &pWVar13->field_10,
                 (undefined1  [24])((undefined1  [24])*pWVar13 & (undefined1  [24])0x2f) ==
                 (undefined1  [24])0x6)) {
                paVar9 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar13->field_10).pFanins[0]
                ;
              }
              uVar15 = paVar9->Fanins[lVar17];
              uVar16 = (ulong)uVar15;
              if (uVar16 != 0) {
                fprintf(__stream,"Node%d");
                fwrite(" -> ",4,1,__stream);
                fprintf(__stream,"Node%d",uVar16);
                fwrite(" [",2,1,__stream);
                if (((int)uVar15 < 1) || (p->nObjsAlloc <= (int)uVar15)) goto LAB_0037a330;
                pcVar12 = "dotted";
                if ((undefined1  [24])((undefined1  [24])p->pObjs[uVar16] & (undefined1  [24])0x40)
                    == (undefined1  [24])0x0) {
                  pcVar12 = "solid";
                }
                fprintf(__stream,"style = %s",pcVar12);
                if ((lVar17 == 0) &&
                   ((undefined1  [24])((undefined1  [24])*pWVar13 & (undefined1  [24])0x3f) ==
                    (undefined1  [24])0x8)) {
                  fprintf(__stream,", style = %s","bold");
                }
                fputc(0x5d,__stream);
                fwrite(";\n",2,1,__stream);
              }
              lVar17 = lVar17 + 1;
              uVar16 = (ulong)(int)pWVar13->nFanins;
            } while (lVar17 < (long)uVar16);
          }
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < p->iObj);
    }
    fputc(0x7d,__stream);
    fputc(10,__stream);
    fputc(10,__stream);
    fclose(__stream);
    if (vBold != (Vec_Int_t *)0x0) {
      Wlc_NtkCleanMarks(p);
      return;
    }
    return;
  }
  fprintf(_stdout,"Cannot visualize WLC with more than %d nodes.\n",2000);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////


/**Function*************************************************************

  Synopsis    [Writes the graph structure of WLC for DOT.]

  Description [Useful for graph visualization using tools such as GraphViz: 
  http://www.graphviz.org/]
  
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Wlc_NtkDumpDot( Wlc_Ntk_t * p, char * pFileName, Vec_Int_t * vBold )
{
    FILE * pFile;
    Wlc_Obj_t * pNode;
    int LevelMax, Prev, Level, i;

    if ( vBold ? (Vec_IntSize(vBold) > 2000) : (Wlc_NtkObjNum(p) > 2000) )
    {
        fprintf( stdout, "Cannot visualize WLC with more than %d nodes.\n", 2000 );
        return;
    }
    if ( (pFile = fopen( pFileName, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", pFileName );
        return;
    }

    // mark the nodes
    if ( vBold )
        Wlc_NtkForEachObjVec( vBold, p, pNode, i )
            pNode->Mark = 1;

    // compute levels
    LevelMax = 1 + Wlc_NtkCreateLevels( p );
    if ( vBold )
        LevelMax = Wlc_NtkRemapLevels( p, vBold, LevelMax );

//    Wlc_NtkForEachObj( p, pNode, i )
//        printf( "Obj=%d Lev=%d\n", i, Wlc_ObjLevel(p, pNode) );
//    printf( "\n" );

    // write the DOT header
    fprintf( pFile, "# %s\n",  "WLC structure generated by ABC" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "digraph WLC {\n" );
    fprintf( pFile, "size = \"7.5,10\";\n" );
//  fprintf( pFile, "ranksep = 0.5;\n" );
//  fprintf( pFile, "nodesep = 0.5;\n" );
    fprintf( pFile, "center = true;\n" );
//  fprintf( pFile, "orientation = landscape;\n" );
//  fprintf( pFile, "edge [fontsize = 10];\n" );
//  fprintf( pFile, "edge [dir = none];\n" );
    fprintf( pFile, "edge [dir = back];\n" );
    fprintf( pFile, "\n" );

    // labels on the left of the picture
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  node [shape = plaintext];\n" );
    fprintf( pFile, "  edge [style = invis];\n" );
    fprintf( pFile, "  LevelTitle1 [label=\"\"];\n" );
    fprintf( pFile, "  LevelTitle2 [label=\"\"];\n" );
    // generate node names with labels
    for ( Level = LevelMax; Level >= 0; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d", Level );
        fprintf( pFile, " [label = " );
        // label name
        fprintf( pFile, "\"" );
        fprintf( pFile, "\"" );
        fprintf( pFile, "];\n" );
    }

    // genetate the sequence of visible/invisible nodes to mark levels
    fprintf( pFile, "  LevelTitle1 ->  LevelTitle2 ->" );
    for ( Level = LevelMax; Level >= 0; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d",  Level );
        // the connector
        if ( Level != 0 )
            fprintf( pFile, " ->" );
        else
            fprintf( pFile, ";" );
    }
    fprintf( pFile, "\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate title box on top
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle1;\n" );
    fprintf( pFile, "  title1 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=20,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    fprintf( pFile, "%s", "WLC structure generated by ABC" );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "Benchmark \\\"%s\\\" from file \\\"%s\\\". ", p->pName, p->pSpec ? Extra_FileNameWithoutPath(p->pSpec) : "unknown" );
//    fprintf( pFile, "Time was %s. ",  Extra_TimeStamp() );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate statistics box
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle2;\n" );
    fprintf( pFile, "  title2 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=18,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    fprintf( pFile, "The word-level network contains %d nodes and spans %d levels.", Wlc_NtkObjNum(p)-Wlc_NtkCiNum(p), LevelMax-1 );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate the COs
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    // the labeling node of this level
    fprintf( pFile, "  Level%d;\n",  LevelMax );
    // generate the CO nodes
    Wlc_NtkForEachCo( p, pNode, i )
    {
        if ( vBold && !pNode->Mark )
            continue;
        pNode = Wlc_ObjCo2PoFo(p, i);
        fprintf( pFile, "  NodePo%d [label = \"%s%s %d\"", Wlc_ObjId(p, pNode), Wlc_ObjName(p, Wlc_ObjId(p, pNode)), Wlc_ObjIsPo(pNode)? "":"_in",  Wlc_ObjRange(pNode) ); 
        fprintf( pFile, ", shape = %s", i < Wlc_NtkPoNum(p) ? "invtriangle" : "box" );
        fprintf( pFile, ", color = coral, fillcolor = coral" );
        fprintf( pFile, "];\n" );
    }
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate nodes of each rank
    for ( Level = LevelMax - 1; Level > 0; Level-- )
    {
        fprintf( pFile, "{\n" );
        fprintf( pFile, "  rank = same;\n" );
        // the labeling node of this level
        fprintf( pFile, "  Level%d;\n",  Level );
        Wlc_NtkForEachObj( p, pNode, i )
        {
            if ( (int)Wlc_ObjLevel(p, pNode) != Level )
                continue;
            if ( vBold && !pNode->Mark )
                continue;

            if ( pNode->Type == WLC_OBJ_CONST )
            {
                //char * pName = Wlc_ObjName(p, i);
                fprintf( pFile, "  Node%d [label = \"%d:%d\'h", i, i, Wlc_ObjRange(pNode) ); 
                if ( Wlc_ObjRange(pNode) > 64 )
                {
                    Abc_TtPrintHexArrayRev( pFile, (word *)Wlc_ObjConstValue(pNode), 16 );
                    fprintf( pFile, "..." );
                }
                else
                    Abc_TtPrintHexArrayRev( pFile, (word *)Wlc_ObjConstValue(pNode), (Wlc_ObjRange(pNode) + 3) / 4 );
                fprintf( pFile, "\"" ); 
            }
            else if ( pNode->Type == WLC_OBJ_BUF || pNode->Type == WLC_OBJ_MUX )
                fprintf( pFile, "  Node%d [label = \"%d: %d\"", i, i, Wlc_ObjRange(pNode) ); 
            else if ( pNode->Type >= WLC_OBJ_LOGIC_NOT && pNode->Type <= WLC_OBJ_COMP_MOREEQU )
                fprintf( pFile, "  Node%d [label = \"%d:%s\"", i, i, Wlc_ObjTypeName(pNode) ); 
            else
                fprintf( pFile, "  Node%d [label = \"%d:%s %d\"", i, i, Wlc_ObjTypeName(pNode), Wlc_ObjRange(pNode) ); 

            if ( pNode->Type == WLC_OBJ_ARI_MULTI )
                fprintf( pFile, ", shape = doublecircle" );
            else if ( pNode->Type >= WLC_OBJ_COMP_EQU && pNode->Type <= WLC_OBJ_COMP_MOREEQU )
                fprintf( pFile, ", shape = diamond" );
            else if ( pNode->Type == WLC_OBJ_BIT_SELECT || pNode->Type == WLC_OBJ_BIT_CONCAT || pNode->Type == WLC_OBJ_FF )
                fprintf( pFile, ", shape = box" );
            else if ( pNode->Type == WLC_OBJ_BUF || pNode->Type == WLC_OBJ_BIT_ZEROPAD || pNode->Type == WLC_OBJ_BIT_SIGNEXT )
                fprintf( pFile, ", shape = triangle" );
            else if ( pNode->Type == WLC_OBJ_MUX )
                fprintf( pFile, ", shape = trapezium" );
            else
                fprintf( pFile, ", shape = ellipse" );

            if ( vBold ? pNode->Mark : ((pNode->Type >= WLC_OBJ_ARI_ADD && pNode->Type <= WLC_OBJ_ARI_SQUARE) || pNode->Type == WLC_OBJ_BIT_NOT) )
                fprintf( pFile, ", style = filled" );
            fprintf( pFile, "];\n" );
        }
        fprintf( pFile, "}" );
        fprintf( pFile, "\n" );
        fprintf( pFile, "\n" );
    }

    // generate the CI nodes
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    // the labeling node of this level
    fprintf( pFile, "  Level%d;\n",  0 );
    // generate the CI nodes
    Wlc_NtkForEachObj( p, pNode, i )
    {
        if ( !Wlc_ObjIsCi(pNode) && Wlc_ObjFaninNum(pNode) > 0 )
            continue;
        if ( vBold && !pNode->Mark )
            continue;
        if ( pNode->Type == WLC_OBJ_CONST )
        {
            //char * pName = Wlc_ObjName(p, i);
            fprintf( pFile, "  Node%d [label = \"%d:%d\'h", i, i, Wlc_ObjRange(pNode) ); 
            if ( Wlc_ObjRange(pNode) > 64 )
            {
                Abc_TtPrintHexArrayRev( pFile, (word *)Wlc_ObjConstValue(pNode), 16 );
                fprintf( pFile, "..." );
            }
            else
                Abc_TtPrintHexArrayRev( pFile, (word *)Wlc_ObjConstValue(pNode), (Wlc_ObjRange(pNode) + 3) / 4 );
            fprintf( pFile, "\"" ); 
        }
        else
        {
            fprintf( pFile, "  Node%d [label = \"%d:%s %d\"", Wlc_ObjId(p, pNode), Wlc_ObjId(p, pNode), Wlc_ObjName(p, Wlc_ObjId(p, pNode)), Wlc_ObjRange(pNode) ); 
            fprintf( pFile, ", shape = %s", (Vec_IntSize(&p->vFfs2) > 0 || Wlc_ObjCiId(pNode) < Wlc_NtkPiNum(p)) ? "triangle" : "box" );
            fprintf( pFile, ", color = coral, fillcolor = coral" );
        }
        fprintf( pFile, "];\n" );
    }
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate invisible edges from the square down
    fprintf( pFile, "title1 -> title2 [style = invis];\n" );
    Wlc_NtkForEachCo( p, pNode, i )
    {
        if ( vBold && !pNode->Mark )
            continue;
        pNode = Wlc_ObjCo2PoFo( p, i );
        fprintf( pFile, "title2 -> NodePo%d [style = invis];\n", Wlc_ObjId(p, pNode) );
    }
    // generate invisible edges among the COs
    Prev = -1;
    Wlc_NtkForEachCo( p, pNode, i )
    {
        pNode = Wlc_ObjCo2PoFo( p, i );
        if ( vBold && !pNode->Mark )
            continue;
        if ( Prev >= 0 )
            fprintf( pFile, "NodePo%d -> NodePo%d [style = invis];\n", Prev, Wlc_ObjId(p, pNode) );
        Prev = Wlc_ObjId(p, pNode);
    }
    // generate invisible edges among the CIs
    Prev = -1;
    Wlc_NtkForEachCi( p, pNode, i )
    {
        if ( vBold && !pNode->Mark )
            continue;
        if ( Prev >= 0 )
            fprintf( pFile, "Node%d -> Node%d [style = invis];\n", Prev, Wlc_ObjId(p, pNode) );
        Prev = Wlc_ObjId(p, pNode);
    }

    // generate edges
    Wlc_NtkForEachCo( p, pNode, i )
    {
        if ( vBold && !pNode->Mark )
            continue;
        fprintf( pFile, "NodePo%d",  Wlc_ObjId(p, Wlc_ObjCo2PoFo(p, i)) );
        fprintf( pFile, " -> " );
        fprintf( pFile, "Node%d",  Wlc_ObjId(p, pNode) );
        fprintf( pFile, " [" );
        fprintf( pFile, "style = %s", pNode->Signed? "dotted" : "solid" );
        fprintf( pFile, "]" );
        fprintf( pFile, ";\n" );
    }
    Wlc_NtkForEachObj( p, pNode, i )
    {
        int k, iFanin;
        if ( Wlc_ObjIsCi(pNode) )
            continue;
        if ( vBold && !pNode->Mark )
            continue;
        // generate the edge from this node to the next
        Wlc_ObjForEachFanin( pNode, iFanin, k ) if ( iFanin )
        {
            fprintf( pFile, "Node%d",  i );
            fprintf( pFile, " -> " );
            fprintf( pFile, "Node%d",  iFanin );
            fprintf( pFile, " [" );
            fprintf( pFile, "style = %s", Wlc_NtkObj(p, iFanin)->Signed? "dotted" : "solid" );
            if ( pNode->Type == WLC_OBJ_MUX && k == 0 )
                fprintf( pFile, ", style = %s", "bold" );
            fprintf( pFile, "]" );
            fprintf( pFile, ";\n" );
        }
    }
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );
    fclose( pFile );

    // unmark nodes
    if ( vBold )
        Wlc_NtkCleanMarks( p );
}